

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_hashmap.h
# Opt level: O2

void __thiscall
v_hashmap<unsigned_long,_features>::put_after_get_nogrow
          (v_hashmap<unsigned_long,_features> *this,unsigned_long *key,uint64_t hash,features *val)

{
  long lVar1;
  features *pfVar2;
  
  (this->dat)._begin[this->last_position].occupied = true;
  (this->dat)._begin[this->last_position].key = *key;
  pfVar2 = &(this->dat)._begin[this->last_position].val;
  for (lVar1 = 100; lVar1 != 0; lVar1 = lVar1 + -1) {
    *(undefined1 *)&(pfVar2->values)._begin = *(undefined1 *)&(val->values)._begin;
    val = (features *)((long)&(val->values)._begin + 1);
    pfVar2 = (features *)((long)&(pfVar2->values)._begin + 1);
  }
  (this->dat)._begin[this->last_position].hash = hash;
  return;
}

Assistant:

void put_after_get_nogrow(const K& key, uint64_t hash, const V& val)
  {  // printf("++[lp=%d\tocc=%d\thash=%llu]\n", last_position, dat[last_position].occupied, hash);
    dat[last_position].occupied = true;
    dat[last_position].key = key;
    dat[last_position].val = val;
    dat[last_position].hash = hash;
  }